

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanics.c
# Opt level: O3

void mc_abi_map_acc_twist_to_wrench(mc_abi *m,gc_acc_twist *xdd,mc_wrench *f)

{
  vector3 htw;
  vector3 hv;
  
  if (m == (mc_abi *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x218,
                  "void mc_abi_map_acc_twist_to_wrench(const struct mc_abi *, const struct gc_acc_twist *, struct mc_wrench *)"
                 );
  }
  if (xdd != (gc_acc_twist *)0x0) {
    if (f != (mc_wrench *)0x0) {
      la_dgemv_nos(3,3,(double *)&m->first_moment_of_mass,3,(double *)xdd->linear_acceleration,1,
                   (double *)&hv,1);
      la_dgemv_noe(3,3,1.0,(double *)&m->second_moment_of_mass,3,(double *)xdd->angular_acceleration
                   ,1,1.0,(double *)&hv,1,(double *)f->torque,1);
      la_dgemv_tos(3,3,(double *)&m->first_moment_of_mass,3,(double *)xdd->angular_acceleration,1,
                   (double *)&htw,1);
      la_dgemv_noe(3,3,1.0,(double *)m,3,(double *)xdd->linear_acceleration,1,1.0,(double *)&htw,1,
                   (double *)f->force,1);
      return;
    }
    __assert_fail("f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x21a,
                  "void mc_abi_map_acc_twist_to_wrench(const struct mc_abi *, const struct gc_acc_twist *, struct mc_wrench *)"
                 );
  }
  __assert_fail("xdd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                ,0x219,
                "void mc_abi_map_acc_twist_to_wrench(const struct mc_abi *, const struct gc_acc_twist *, struct mc_wrench *)"
               );
}

Assistant:

void mc_abi_map_acc_twist_to_wrench(
        const struct mc_abi *m,
        const struct gc_acc_twist *xdd,
        struct mc_wrench *f)
{
    assert(m);
    assert(xdd);
    assert(f);

    // H v
    struct vector3 hv;
    la_dgemv_nos(3, 3,
            (double *)&m->first_moment_of_mass, 3,
            (double *)xdd->linear_acceleration, 1,
            (double *)&hv, 1);

    // n = I w + H v
    la_dgemv_noe(3, 3,
            1.0, (double *)&m->second_moment_of_mass, 3, (double *)xdd->angular_acceleration, 1,
            1.0, (double *)&hv, 1,
            (double *)f->torque, 1);

    // H^T w
    struct vector3 htw;
    la_dgemv_tos(3, 3,
            (double *)&m->first_moment_of_mass, 3,
            (double *)xdd->angular_acceleration, 1,
            (double *)&htw, 1);

    // f = M v + H^T w
    la_dgemv_noe(3, 3,
            1.0, (double *)&m->zeroth_moment_of_mass, 3, (double *)xdd->linear_acceleration, 1,
            1.0, (double *)&htw, 1,
            (double *)f->force, 1);
}